

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O2

bool __thiscall ki::protocol::net::ClientSession::is_alive(ClientSession *this)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  
  lVar3 = 7000000000;
  puVar2 = &this->field_0x10;
  if ((&this->field_0xa)[(long)this->_vptr_ClientSession[-3]] != '\0') {
    lVar3 = 121000000000;
    puVar2 = &this->field_0x28;
  }
  lVar1 = std::chrono::_V2::steady_clock::now();
  return lVar1 - *(long *)(puVar2 + (long)this->_vptr_ClientSession[-3]) < lVar3;
}

Assistant:

bool ClientSession::is_alive() const
	{
		// If the session isn't established yet, use the time of
		// creation to decide whether this session is alive.
		if (!m_established)
			return std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_creation_time
			).count() <= (KI_CONNECTION_TIMEOUT * 2);

		// Otherwise, use the last time we received a heartbeat.
		return std::chrono::duration_cast<std::chrono::seconds>(
			std::chrono::steady_clock::now() - m_last_received_heartbeat_time
		).count() <= (KI_SERVER_HEARTBEAT * 2);
	}